

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O3

int ply_write_chunk(p_ply ply,void *anybuffer,size_t size)

{
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  
  if (size != 0) {
    uVar3 = 0;
    do {
      if (ply->buffer_last < 0x2000) {
        pcVar1 = (char *)((long)anybuffer + uVar3);
        uVar3 = uVar3 + 1;
        ply->buffer[ply->buffer_last] = *pcVar1;
        ply->buffer_last = ply->buffer_last + 1;
      }
      else {
        ply->buffer_last = 0;
        sVar2 = fwrite(ply->buffer,1,0x2000,(FILE *)ply->fp);
        if (sVar2 < 0x2000) {
          return 0;
        }
      }
    } while (uVar3 < size);
  }
  return 1;
}

Assistant:

static int ply_write_chunk(p_ply ply, void *anybuffer, size_t size) {
    char *buffer = (char *)anybuffer;
    size_t i = 0;
    assert(ply && ply->fp && ply->io_mode == PLY_WRITE);
    assert(ply->buffer_last <= BUFFERSIZE);
    while (i < size) {
        if (ply->buffer_last < BUFFERSIZE) {
            ply->buffer[ply->buffer_last] = buffer[i];
            ply->buffer_last++;
            i++;
        } else {
            ply->buffer_last = 0;
            if (fwrite(ply->buffer, 1, BUFFERSIZE, ply->fp) < BUFFERSIZE)
                return 0;
        }
    }
    return 1;
}